

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseConnection.cpp
# Opt level: O1

Result __thiscall tonk::Connection::initSubsystems(Connection *this)

{
  WindowHeader *pWVar1;
  uint uVar2;
  undefined8 uVar3;
  pointer __p;
  waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>
  *pwVar4;
  undefined8 *puVar5;
  uint uVar6;
  long in_RSI;
  Result *success;
  Result result;
  undefined1 local_90 [16];
  undefined1 local_80 [32];
  ReceiverBandwidthControl *pRStack_60;
  WindowHeader *local_58;
  WindowHeader *local_50;
  ReceiverBandwidthControl *local_48;
  WindowHeader *local_40;
  
  *(undefined8 *)(in_RSI + 0xc8c6) = 0;
  *(undefined8 *)(in_RSI + 0xc8ce) = 0;
  *(undefined8 *)(in_RSI + 0xc8d6) = 0;
  *(undefined8 *)(in_RSI + 0xc8de) = 0;
  *(undefined8 *)(in_RSI + 0xc8bc) = 0;
  *(undefined8 *)(in_RSI + 0xc8c4) = 0;
  *(undefined8 *)(in_RSI + 0xc8cc) = 0;
  *(undefined8 *)(in_RSI + 0xc8d4) = 0;
  *(undefined1 (*) [16])(in_RSI + 0xc90c) = ZEXT416(0) << 0x40;
  *(undefined8 *)(in_RSI + 0xc91a) = 0;
  uVar2 = *(uint *)(*(long *)(in_RSI + 0xe0) + 0x4c);
  local_80._24_8_ =
       CONCAT62(local_80._26_6_,CONCAT11((byte)uVar2 >> 3,(uVar2 & 4) == 0)) & 0xffffffffffff01ff;
  local_80._16_8_ = in_RSI + 0x110;
  local_58 = *(WindowHeader **)(in_RSI + 0x78);
  pRStack_60 = (ReceiverBandwidthControl *)local_80._16_8_;
  local_50 = (WindowHeader *)(in_RSI + 8);
  local_48 = (ReceiverBandwidthControl *)(in_RSI + 0xc5f8);
  SessionOutgoing::Initialize
            ((SessionOutgoing *)local_90,(Dependencies *)(in_RSI + 0x168),
             (uint64_t)(local_80 + 0x18));
  uVar3 = local_80._16_8_;
  if ((ErrorResult *)local_90._0_8_ == (ErrorResult *)0x0) {
    pRStack_60 = (ReceiverBandwidthControl *)(in_RSI + 0x60);
    pWVar1 = (WindowHeader *)(in_RSI + 0xc5b0);
    local_40 = (WindowHeader *)local_80._16_8_;
    local_90._8_8_ = this;
    local_80._8_8_ = (ReceiverBandwidthControl *)(in_RSI + 0xc5f8);
    local_80._24_8_ = (WindowHeader *)(in_RSI + 8);
    local_58 = pWVar1;
    local_50 = (WindowHeader *)(in_RSI + 0x168);
    local_48 = (ReceiverBandwidthControl *)(in_RSI + 0xc658);
    SessionIncoming::Initialize
              ((SessionIncoming *)local_80,(Dependencies *)(in_RSI + 0x6310),
               (uint64_t)(local_80 + 0x18),*(TonkConnectionConfig **)(in_RSI + 0xc8f8),
               (TonkConnection)(in_RSI + 0xe8));
    local_90._0_8_ = local_80._0_8_;
    local_80._0_8_ = (_func_int **)0x0;
    Result::~Result((Result *)local_80);
    this = (Connection *)local_90._8_8_;
    if ((ErrorResult *)local_90._0_8_ == (ErrorResult *)0x0) {
      uVar2 = *(uint *)(*(long *)(in_RSI + 0xe0) + 0x48);
      uVar6 = 20000000;
      if (uVar2 < 20000000) {
        uVar6 = uVar2;
      }
      local_80._0_8_ = CONCAT44(uVar6,(int)local_80._0_8_) & 0xffffffffffffff00;
      pRStack_60 = (ReceiverBandwidthControl *)uVar3;
      local_80._24_8_ = pWVar1;
      SenderBandwidthControl::Initialize
                ((SenderBandwidthControl *)local_80._8_8_,(Dependencies *)(local_80 + 0x18),
                 (Parameters *)local_80);
      pRStack_60 = (ReceiverBandwidthControl *)uVar3;
      local_80._24_8_ = pWVar1;
      ReceiverBandwidthControl::Initialize
                ((ReceiverBandwidthControl *)(in_RSI + 0xc658),(Dependencies *)(local_80 + 0x18));
      puVar5 = *(undefined8 **)(in_RSI + 0xa0);
      __p = (pointer)operator_new(0x40,(nothrow_t *)&std::nothrow);
      if (__p == (pointer)0x0) {
        __p = (pointer)0x0;
      }
      else {
        local_80._24_8_ =
             &asio::detail::
              typeid_wrapper<asio::waitable_timer_service<std::chrono::_V2::steady_clock,asio::wait_traits<std::chrono::_V2::steady_clock>>>
              ::typeinfo;
        pRStack_60 = (ReceiverBandwidthControl *)0x0;
        pwVar4 = (waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>
                  *)asio::detail::service_registry::do_use_service
                              ((service_registry *)*puVar5,(key *)(local_80 + 0x18),
                               asio::detail::service_registry::
                               create<asio::waitable_timer_service<std::chrono::_V2::steady_clock,asio::wait_traits<std::chrono::_V2::steady_clock>>,asio::io_context>
                               ,puVar5);
        (__p->
        super_basic_io_object<asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>,_true>
        ).service_ = pwVar4;
        (__p->
        super_basic_io_object<asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>,_true>
        ).implementation_.expiry.__d.__r = 0;
        (__p->
        super_basic_io_object<asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>,_true>
        ).implementation_.timer_data.op_queue_.front_ = (wait_op *)0x0;
        (__p->
        super_basic_io_object<asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>,_true>
        ).implementation_.timer_data.op_queue_.back_ = (wait_op *)0x0;
        (__p->
        super_basic_io_object<asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>,_true>
        ).implementation_.timer_data.heap_index_ = 0xffffffffffffffff;
        (__p->
        super_basic_io_object<asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>,_true>
        ).implementation_.timer_data.next_ = (per_timer_data *)0x0;
        (__p->
        super_basic_io_object<asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>,_true>
        ).implementation_.timer_data.prev_ = (per_timer_data *)0x0;
        (__p->
        super_basic_io_object<asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>,_true>
        ).implementation_.might_have_pending_waits = false;
      }
      std::
      __uniq_ptr_impl<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>,_std::default_delete<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>_>_>
      ::reset((__uniq_ptr_impl<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>,_std::default_delete<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>_>_>
               *)(in_RSI + 0xc868),__p);
      if (*(long *)(in_RSI + 0xc868) == 0) {
        local_80._24_8_ = &local_58;
        pRStack_60 = (ReceiverBandwidthControl *)0x0;
        local_58 = (WindowHeader *)((ulong)local_58 & 0xffffffffffffff00);
        puVar5 = (undefined8 *)operator_new(0x38);
        *puVar5 = "Out of memory";
        puVar5[1] = puVar5 + 3;
        puVar5[2] = 0;
        *(undefined1 *)(puVar5 + 3) = 0;
        *(undefined4 *)(puVar5 + 5) = 0;
        puVar5[6] = 0x10;
        *(undefined8 **)local_90._8_8_ = puVar5;
        this = (Connection *)local_90._8_8_;
      }
      else {
        *(undefined8 *)local_90._8_8_ = 0;
        this = (Connection *)local_90._8_8_;
      }
      goto LAB_0013674f;
    }
  }
  (this->super_IConnection)._vptr_IConnection = (_func_int **)local_90._0_8_;
  local_90._0_8_ = (ErrorResult *)0x0;
LAB_0013674f:
  Result::~Result((Result *)local_90);
  return (Result)(ErrorResult *)this;
}

Assistant:

Result Connection::initSubsystems()
{
#ifdef TONK_DETAILED_STATS
    // Cycle the detail statistics
    Deets.NextWrite();
    Deets.GetWritePtr()->TimestampUsec = siamese::GetTimeUsec();
#endif // TONK_DETAILED_STATS

    memset(&CachedLocalAddress, 0, sizeof(CachedLocalAddress));
    memset(&LastIdAndAddressSent, 0, sizeof(LastIdAndAddressSent));

    const bool enableCompression = \
        (SocketConfig->Flags & TONK_FLAGS_DISABLE_COMPRESSION) == 0;

    const bool enablePadding = \
        (SocketConfig->Flags & TONK_FLAGS_ENABLE_PADDING) != 0;

    Result result = Outgoing.Initialize({
        enableCompression,
        enablePadding,
        &Logger,
        Deps.UDPSender,
        &SelfRefCount,
#ifdef TONK_DETAILED_STATS
        &Deets,
#endif // TONK_DETAILED_STATS
        &SenderControl
    },
        EncryptionKey);
    if (result.IsFail()) {
        return result;
    }

    // Initialize Incoming object given the app context
    result = Incoming.Initialize({
        &SelfRefCount,
        this,
        &TimeSync,
        &Outgoing,
        &ReceiverControl,
#ifdef TONK_DETAILED_STATS
        &Deets,
#endif // TONK_DETAILED_STATS
        &Logger
    },
        EncryptionKey,
        &ConnectionConfig,
        GetTonkConnection());
    if (result.IsFail()) {
        return result;
    }

    // Configure the bandwidth limit
    SenderBandwidthControl::Parameters sparams;
    sparams.MaximumBPS = (unsigned)SocketConfig->BandwidthLimitBPS;
    if (sparams.MaximumBPS > TONK_MAX_BPS) {
        sparams.MaximumBPS = TONK_MAX_BPS;
    }

    // Initialize bandwidth control
    SenderControl.Initialize({
        &TimeSync,
        &Logger
    },
        sparams);
    ReceiverControl.Initialize({
        &TimeSync,
        &Logger
    });

    // Create the timer
    Ticker = MakeUniqueNoThrow<asio::steady_timer>(*Deps.Context);
    if (!Ticker) {
        return Result::OutOfMemory();
    }

    return Result::Success();
}